

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

size_t absl::numbers_internal::SixDigitsToBuffer(double d,Nonnull<char_*> buffer)

{
  undefined4 uVar1;
  byte *pbVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  ExpDigits EVar8;
  int dig1;
  char *digits;
  int exp;
  uint32_t uStack_38;
  char cStack_34;
  char cStack_32;
  ExpDigits exp_dig;
  char *out;
  Nonnull<char_*> buffer_local;
  double d_local;
  
  uVar5 = std::isnan(d);
  if ((uVar5 & 1) == 0) {
    unique0x100002e0 = (byte *)buffer;
    if ((d != 0.0) || (NAN(d))) {
      buffer_local = (Nonnull<char_*>)d;
      if (d < 0.0) {
        register0x00000008 = (byte *)(buffer + 1);
        *buffer = '-';
        buffer_local = (Nonnull<char_*>)((ulong)d ^ 0x8000000000000000);
      }
      dVar7 = std::numeric_limits<double>::max();
      if ((double)buffer_local <= dVar7) {
        EVar8 = SplitToSix((double)buffer_local);
        exp_dig.exponent._0_1_ = EVar8.digits[4];
        exp_dig.exponent._1_1_ = EVar8.digits[5];
        cStack_34 = EVar8.digits[0];
        cStack_32 = EVar8.digits[2];
        uStack_38 = EVar8.exponent;
        digits._4_4_ = uStack_38;
        *stack0xffffffffffffffd8 = '0';
        ((char *)stack0xffffffffffffffd8)[1] = '.';
        uVar1 = EVar8.digits._0_4_;
        switch(uStack_38) {
        case 0:
          *stack0xffffffffffffffd8 = cStack_34;
          ((char *)stack0xffffffffffffffd8)[1] = '.';
          *(int *)((char *)stack0xffffffffffffffd8 + 2) = EVar8.digits._1_4_;
          ((char *)stack0xffffffffffffffd8)[6] = exp_dig.exponent._1_1_;
          for (register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 7);
              ((char *)stack0xffffffffffffffd8)[-1] == '0';
              register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1)) {
          }
          if (((char *)stack0xffffffffffffffd8)[-1] == '.') {
            register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1);
          }
          *stack0xffffffffffffffd8 = '\0';
          d_local = (double)((long)stack0xffffffffffffffd8 - (long)buffer);
          break;
        case 1:
          *(short *)stack0xffffffffffffffd8 = EVar8.digits._0_2_;
          ((char *)stack0xffffffffffffffd8)[2] = '.';
          *(int *)((char *)stack0xffffffffffffffd8 + 3) = EVar8.digits._2_4_;
          for (register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 7);
              ((char *)stack0xffffffffffffffd8)[-1] == '0';
              register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1)) {
          }
          if (((char *)stack0xffffffffffffffd8)[-1] == '.') {
            register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1);
          }
          *stack0xffffffffffffffd8 = '\0';
          d_local = (double)((long)stack0xffffffffffffffd8 - (long)buffer);
          break;
        case 2:
          *(short *)stack0xffffffffffffffd8 = EVar8.digits._0_2_;
          ((char *)stack0xffffffffffffffd8)[2] = cStack_32;
          ((char *)stack0xffffffffffffffd8)[3] = '.';
          *(short *)((char *)stack0xffffffffffffffd8 + 4) = EVar8.digits._3_2_;
          ((char *)stack0xffffffffffffffd8)[6] = exp_dig.exponent._1_1_;
          for (register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 7);
              ((char *)stack0xffffffffffffffd8)[-1] == '0';
              register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1)) {
          }
          if (((char *)stack0xffffffffffffffd8)[-1] == '.') {
            register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1);
          }
          *stack0xffffffffffffffd8 = '\0';
          d_local = (double)((long)stack0xffffffffffffffd8 - (long)buffer);
          break;
        case 3:
          *(undefined4 *)stack0xffffffffffffffd8 = uVar1;
          pbVar2 = (byte *)((char *)stack0xffffffffffffffd8 + 4);
          if ((exp_dig.exponent._1_1_ | (byte)exp_dig.exponent) != 0x30) {
            ((char *)stack0xffffffffffffffd8)[4] = 0x2e;
            ((char *)stack0xffffffffffffffd8)[5] = (byte)exp_dig.exponent;
            pbVar2 = (byte *)((char *)stack0xffffffffffffffd8 + 6);
            if (exp_dig.exponent._1_1_ != 0x30) {
              ((char *)stack0xffffffffffffffd8)[6] = exp_dig.exponent._1_1_;
              pbVar2 = (byte *)((char *)stack0xffffffffffffffd8 + 7);
            }
          }
          stack0xffffffffffffffd8 = pbVar2;
          *stack0xffffffffffffffd8 = 0;
          d_local = (double)((long)stack0xffffffffffffffd8 - (long)buffer);
          break;
        case 4:
          *(undefined4 *)stack0xffffffffffffffd8 = uVar1;
          ((char *)stack0xffffffffffffffd8)[4] = (byte)exp_dig.exponent;
          pcVar3 = (char *)stack0xffffffffffffffd8 + 5;
          if (exp_dig.exponent._1_1_ != 0x30) {
            ((char *)stack0xffffffffffffffd8)[5] = '.';
            ((char *)stack0xffffffffffffffd8)[6] = exp_dig.exponent._1_1_;
            pcVar3 = (char *)stack0xffffffffffffffd8 + 7;
          }
          stack0xffffffffffffffd8 = (byte *)pcVar3;
          *stack0xffffffffffffffd8 = '\0';
          d_local = (double)((long)stack0xffffffffffffffd8 - (long)buffer);
          break;
        case 5:
          *(undefined4 *)stack0xffffffffffffffd8 = uVar1;
          *(short *)((char *)stack0xffffffffffffffd8 + 4) = EVar8.digits._4_2_;
          ((char *)stack0xffffffffffffffd8)[6] = '\0';
          d_local = (double)((long)((char *)stack0xffffffffffffffd8 + 6) - (long)buffer);
          break;
        case 0xfffffffc:
          ((char *)stack0xffffffffffffffd8)[2] = '0';
          register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 1);
        case 0xfffffffd:
          ((char *)stack0xffffffffffffffd8)[2] = '0';
          register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 1);
        case 0xfffffffe:
          ((char *)stack0xffffffffffffffd8)[2] = '0';
          register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 1);
        case 0xffffffff:
          *(undefined4 *)((char *)stack0xffffffffffffffd8 + 2) = uVar1;
          *(short *)((char *)stack0xffffffffffffffd8 + 6) = EVar8.digits._4_2_;
          for (register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 8);
              ((char *)stack0xffffffffffffffd8)[-1] == '0';
              register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1)) {
          }
          *stack0xffffffffffffffd8 = '\0';
          d_local = (double)((long)stack0xffffffffffffffd8 - (long)buffer);
          break;
        default:
          if (-5 < (int)uStack_38 && (int)uStack_38 < 6) {
            __assert_fail("exp < -4 || exp >= 6",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                          ,0x288,
                          "size_t absl::numbers_internal::SixDigitsToBuffer(double, const absl::Nonnull<char *>)"
                         );
          }
          *stack0xffffffffffffffd8 = cStack_34;
          if (((char *)stack0xffffffffffffffd8)[1] != '.') {
            __assert_fail("out[1] == \'.\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                          ,0x28a,
                          "size_t absl::numbers_internal::SixDigitsToBuffer(double, const absl::Nonnull<char *>)"
                         );
          }
          *(int *)((char *)stack0xffffffffffffffd8 + 2) = EVar8.digits._1_4_;
          ((char *)stack0xffffffffffffffd8)[6] = exp_dig.exponent._1_1_;
          for (register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + 7);
              ((char *)stack0xffffffffffffffd8)[-1] == '0';
              register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1)) {
          }
          if (((char *)stack0xffffffffffffffd8)[-1] == '.') {
            register0x00000000 = (byte *)((char *)stack0xffffffffffffffd8 + -1);
          }
          pcVar3 = (char *)stack0xffffffffffffffd8;
          *stack0xffffffffffffffd8 = 'e';
          if ((int)uStack_38 < 1) {
            ((char *)stack0xffffffffffffffd8)[1] = '-';
            digits._4_4_ = -uStack_38;
          }
          else {
            ((char *)stack0xffffffffffffffd8)[1] = '+';
          }
          stack0xffffffffffffffd8 = (byte *)((char *)stack0xffffffffffffffd8 + 2);
          if (99 < (int)digits._4_4_) {
            iVar6 = (int)digits._4_4_ / 100;
            digits._4_4_ = (int)digits._4_4_ % 100;
            *stack0xffffffffffffffd8 = (char)iVar6 + '0';
            unique0x10000288 = (byte *)(pcVar3 + 3);
          }
          PutTwoDigits(digits._4_4_,(Nonnull<char_*>)stack0xffffffffffffffd8);
          ((Nonnull<char_*>)stack0xffffffffffffffd8)[2] = '\0';
          d_local = (double)((long)((Nonnull<char_*>)stack0xffffffffffffffd8 + 2) - (long)buffer);
        }
      }
      else {
        strcpy((char *)stack0xffffffffffffffd8,"inf");
        d_local = (double)((char *)stack0xffffffffffffffd8 + (3 - (long)buffer));
      }
    }
    else {
      bVar4 = std::signbit(d);
      if (bVar4) {
        register0x00000008 = (byte *)(buffer + 1);
        *buffer = '-';
      }
      *stack0xffffffffffffffd8 = '0';
      ((Nonnull<char_*>)stack0xffffffffffffffd8)[1] = '\0';
      d_local = (double)((long)((Nonnull<char_*>)stack0xffffffffffffffd8 + 1) - (long)buffer);
    }
  }
  else {
    strcpy(buffer,"nan");
    d_local = 1.48219693752374e-323;
  }
  return (size_t)d_local;
}

Assistant:

size_t numbers_internal::SixDigitsToBuffer(double d,
                                           absl::Nonnull<char*> const buffer) {
  static_assert(std::numeric_limits<float>::is_iec559,
                "IEEE-754/IEC-559 support only");

  char* out = buffer;  // we write data to out, incrementing as we go, but
                       // FloatToBuffer always returns the address of the buffer
                       // passed in.

  if (std::isnan(d)) {
    strcpy(out, "nan");  // NOLINT(runtime/printf)
    return 3;
  }
  if (d == 0) {  // +0 and -0 are handled here
    if (std::signbit(d)) *out++ = '-';
    *out++ = '0';
    *out = 0;
    return static_cast<size_t>(out - buffer);
  }
  if (d < 0) {
    *out++ = '-';
    d = -d;
  }
  if (d > std::numeric_limits<double>::max()) {
    strcpy(out, "inf");  // NOLINT(runtime/printf)
    return static_cast<size_t>(out + 3 - buffer);
  }

  auto exp_dig = SplitToSix(d);
  int exp = exp_dig.exponent;
  const char* digits = exp_dig.digits;
  out[0] = '0';
  out[1] = '.';
  switch (exp) {
    case 5:
      memcpy(out, &digits[0], 6), out += 6;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 4:
      memcpy(out, &digits[0], 5), out += 5;
      if (digits[5] != '0') {
        *out++ = '.';
        *out++ = digits[5];
      }
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 3:
      memcpy(out, &digits[0], 4), out += 4;
      if ((digits[5] | digits[4]) != '0') {
        *out++ = '.';
        *out++ = digits[4];
        if (digits[5] != '0') *out++ = digits[5];
      }
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 2:
      memcpy(out, &digits[0], 3), out += 3;
      *out++ = '.';
      memcpy(out, &digits[3], 3);
      out += 3;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 1:
      memcpy(out, &digits[0], 2), out += 2;
      *out++ = '.';
      memcpy(out, &digits[2], 4);
      out += 4;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 0:
      memcpy(out, &digits[0], 1), out += 1;
      *out++ = '.';
      memcpy(out, &digits[1], 5);
      out += 5;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case -4:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -3:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -2:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -1:
      out += 2;
      memcpy(out, &digits[0], 6);
      out += 6;
      while (out[-1] == '0') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
  }
  assert(exp < -4 || exp >= 6);
  out[0] = digits[0];
  assert(out[1] == '.');
  out += 2;
  memcpy(out, &digits[1], 5), out += 5;
  while (out[-1] == '0') --out;
  if (out[-1] == '.') --out;
  *out++ = 'e';
  if (exp > 0) {
    *out++ = '+';
  } else {
    *out++ = '-';
    exp = -exp;
  }
  if (exp > 99) {
    int dig1 = exp / 100;
    exp -= dig1 * 100;
    *out++ = '0' + static_cast<char>(dig1);
  }
  PutTwoDigits(static_cast<uint32_t>(exp), out);
  out += 2;
  *out = 0;
  return static_cast<size_t>(out - buffer);
}